

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  uint uSupports_00;
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int nVarsNew;
  uint uSupports;
  int v;
  abctime clk;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  aVar2 = Abc_Clock();
  clk._4_4_ = nVars;
LAB_006363d9:
  do {
    nVarsNew = nVars + -1;
    if (-1 < nVarsNew) {
      uSupports_00 = Dau_DsdFindSupports(p,pTruth,pVars,clk._4_4_,nVarsNew);
      if ((uSupports_00 & uSupports_00 >> 1 & 0x55555555) == 0) {
        iVar1 = Dau_DsdDecomposeTripleVarsOuter(p,pTruth,pVars,clk._4_4_,nVarsNew);
        return iVar1;
      }
      iVar1 = Abc_TtSuppOnlyOne(uSupports_00 & (uSupports_00 ^ 0xffffffff) >> 1 & 0x55555555);
      nVars = nVarsNew;
      if (((iVar1 == 0) ||
          (iVar1 = Abc_TtSuppOnlyOne((uSupports_00 ^ 0xffffffff) & uSupports_00 >> 1 & 0x55555555),
          iVar1 == 0)) ||
         (iVar1 = Dau_DsdDecomposeTripleVarsInner(p,pTruth,pVars,clk._4_4_,nVarsNew,uSupports_00),
         iVar1 == clk._4_4_)) goto LAB_006363d9;
      if (iVar1 == 0) {
        aVar3 = Abc_Clock();
        s_Times[2] = (aVar3 - aVar2) + s_Times[2];
        return 0;
      }
      clk._4_4_ = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,iVar1);
      if (clk._4_4_ == 0) {
        aVar3 = Abc_Clock();
        s_Times[2] = (aVar3 - aVar2) + s_Times[2];
        return 0;
      }
    }
    nVars = clk._4_4_;
    if (nVarsNew == -1) {
      aVar3 = Abc_Clock();
      s_Times[2] = (aVar3 - aVar2) + s_Times[2];
      return clk._4_4_;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_DsdFindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_DsdDecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_DsdDecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}